

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void __thiscall
Pubkey_DefaultConstructorTest_Test::TestBody(Pubkey_DefaultConstructorTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  allocator local_171;
  string local_170;
  ByteData local_150;
  ByteData local_138;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Message local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Pubkey pubkey;
  Pubkey_DefaultConstructorTest_Test *this_local;
  
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_58,(Pubkey *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ((internal *)local_38,"\"\"","pubkey.GetHex().c_str()","",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  bVar1 = cfd::core::Pubkey::IsCompress((Pubkey *)&gtest_ar.message_);
  local_89 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_88,
               (AssertionResult *)"pubkey.IsCompress()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar1 = cfd::core::Pubkey::IsValid((Pubkey *)&gtest_ar.message_);
  local_d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_d0,(AssertionResult *)0x6e7a91,
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  cfd::core::Pubkey::GetData(&local_138,(Pubkey *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",&local_171);
  cfd::core::ByteData::ByteData(&local_150,&local_170);
  local_119 = cfd::core::ByteData::Equals(&local_138,&local_150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  cfd::core::ByteData::~ByteData(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  cfd::core::ByteData::~ByteData(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_118,
               (AssertionResult *)"pubkey.GetData().Equals(ByteData(\"\"))","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Pubkey, DefaultConstructorTest) {
  Pubkey pubkey = Pubkey();

  EXPECT_STREQ("", pubkey.GetHex().c_str());
  EXPECT_FALSE(pubkey.IsCompress());
  EXPECT_FALSE(pubkey.IsValid());
  EXPECT_TRUE(pubkey.GetData().Equals(ByteData("")));
}